

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  char *pcVar3;
  CompilerError *pCVar4;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string local_490;
  allocator local_46e;
  allocator local_46d;
  allocator local_46c;
  allocator local_46b;
  allocator local_46a;
  allocator local_469;
  string local_468;
  allocator local_442;
  allocator local_441;
  string local_440;
  allocator local_41a;
  allocator local_419;
  string local_418;
  allocator local_3f2;
  allocator local_3f1;
  string local_3f0;
  allocator local_3ca;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a2;
  allocator local_3a1;
  string local_3a0;
  allocator local_37a;
  allocator local_379;
  string local_378;
  allocator local_352;
  allocator local_351;
  string local_350;
  allocator local_32a;
  allocator local_329;
  string local_328;
  allocator local_303;
  allocator local_302;
  allocator local_301;
  allocator local_300;
  allocator local_2ff;
  allocator local_2fe;
  allocator local_2fd;
  allocator local_2fc;
  allocator local_2fb;
  allocator local_2fa;
  allocator local_2f9;
  allocator local_2f8;
  allocator local_2f7;
  allocator local_2f6;
  allocator local_2f5;
  allocator local_2f4;
  allocator local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  allocator local_2f0;
  allocator local_2ef;
  allocator local_2ee;
  allocator local_2ed;
  allocator local_2ec;
  allocator local_2eb;
  allocator local_2ea;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_29b;
  allocator local_29a;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_24a;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1fa;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d3;
  allocator local_1d2;
  allocator local_1d1;
  string local_1d0;
  allocator local_1aa;
  allocator local_1a9;
  string local_1a8;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  string local_180;
  allocator local_15a;
  allocator local_159;
  string local_158;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  string local_130;
  allocator local_10f;
  allocator local_10e;
  allocator local_10d;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  allocator local_108;
  allocator local_107;
  allocator local_106;
  allocator local_105;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  allocator local_100;
  allocator local_ff;
  allocator local_fe;
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_ad;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  ExecutionModel local_88;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  ExecutionModel model;
  allocator local_5a;
  allocator local_59;
  string local_58;
  allocator local_35 [20];
  allocator local_21;
  StorageClass local_20;
  BuiltIn local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerGLSL *this_local;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000000c,storage);
  local_20 = storage;
  local_1c = builtin;
  _storage_local = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if (builtin == BuiltInPosition) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_Position",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (builtin == BuiltInPointSize) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PointSize",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (builtin == BuiltInClipDistance) {
    if (((this->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_58,"GL_EXT_clip_cull_distance",&local_59);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ClipDistance",&local_5a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  }
  else if (builtin == BuiltInCullDistance) {
    if (((this->options).es & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&model,"GL_EXT_clip_cull_distance",&local_81);
      require_extension_internal(this,(string *)&model);
      ::std::__cxx11::string::~string((string *)&model);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_CullDistance",&local_82);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_82);
  }
  else if (builtin == BuiltInVertexId) {
    if (((this->options).vulkan_semantics & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                );
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexID",&local_83);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_83);
  }
  else if (builtin == BuiltInInstanceId) {
    if (((this->options).vulkan_semantics & 1U) != 0) {
      pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
      local_88 = pSVar2->model;
      if (2 < local_88 - ExecutionModelIntersectionKHR) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,
                   "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                  );
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x8c)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"GL_ARB_draw_instanced",&local_a9);
      require_extension_internal(this,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InstanceID",&local_aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  }
  else if (builtin == BuiltInPrimitiveId) {
    if ((storage == StorageClassInput) &&
       (pSVar2 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar2->model == ExecutionModelGeometry)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PrimitiveIDIn",&local_fc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PrimitiveID",&local_fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd);
    }
  }
  else if (builtin == BuiltInInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InvocationID",&local_fe);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_fe);
  }
  else if (builtin == BuiltInLayer) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_Layer",&local_ff);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_ff);
  }
  else if (builtin == BuiltInViewportIndex) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewportIndex",&local_100);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_100);
  }
  else if (builtin == BuiltInTessLevelOuter) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessLevelOuter",&local_101);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  else if (builtin == BuiltInTessLevelInner) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessLevelInner",&local_102);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_102);
  }
  else if (builtin == BuiltInTessCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_TessCoord",&local_103);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_103);
  }
  else if (builtin == BuiltInPatchVertices) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PatchVerticesIn",&local_104)
    ;
    ::std::allocator<char>::~allocator((allocator<char> *)&local_104);
  }
  else if (builtin == BuiltInFragCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FragCoord",&local_105);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_105);
  }
  else if (builtin == BuiltInPointCoord) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_PointCoord",&local_106);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_106);
  }
  else if (builtin == BuiltInFrontFacing) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FrontFacing",&local_107);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_107);
  }
  else if (builtin == BuiltInSampleId) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_248,"GL_ARB_sample_shading",&local_249);
        require_extension_internal(this,&local_248);
        ::std::__cxx11::string::~string((string *)&local_248);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_220,"GL_OES_sample_variables",&local_221);
      require_extension_internal(this,&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleID",&local_24a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_24a);
  }
  else if (builtin == BuiltInSamplePosition) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2e8,"GL_ARB_sample_shading",&local_2e9);
        require_extension_internal(this,&local_2e8);
        ::std::__cxx11::string::~string((string *)&local_2e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2c0,"GL_OES_sample_variables",&local_2c1);
      require_extension_internal(this,&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SamplePosition",&local_2ea);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ea);
  }
  else if (builtin == BuiltInSampleMask) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Sample variables not supported in legacy GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_298,"GL_ARB_sample_shading",&local_299);
        require_extension_internal(this,&local_298);
        ::std::__cxx11::string::~string((string *)&local_298);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_270,"GL_OES_sample_variables",&local_271);
      require_extension_internal(this,&local_270);
      ::std::__cxx11::string::~string((string *)&local_270);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
    if (local_20 == StorageClassInput) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleMaskIn",&local_29a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SampleMask",&local_29b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29b);
    }
  }
  else if (builtin == BuiltInFragDepth) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_FragDepth",&local_108);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_108);
  }
  else if (builtin == BuiltInHelperInvocation) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_HelperInvocation",&local_10f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10f);
  }
  else if (builtin == BuiltInNumWorkgroups) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_NumWorkGroups",&local_109);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  else if (builtin == BuiltInWorkgroupSize) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_WorkGroupSize",&local_10a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10a);
  }
  else if (builtin == BuiltInWorkgroupId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_WorkGroupID",&local_10b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10b);
  }
  else if (builtin == BuiltInLocalInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_LocalInvocationID",&local_10c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10c);
  }
  else if (builtin == BuiltInGlobalInvocationId) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_GlobalInvocationID",&local_10d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10d);
  }
  else if (builtin == BuiltInLocalInvocationIndex) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_LocalInvocationIndex",&local_10e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10e);
  }
  else if (builtin == BuiltInSubgroupSize) {
    request_subgroup_feature(this,SubgroupSize);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupSize",&local_2ef);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef);
  }
  else if (builtin == BuiltInNumSubgroups) {
    request_subgroup_feature(this,NumSubgroups);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_NumSubgroups",&local_2ed);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed);
  }
  else if (builtin == BuiltInSubgroupId) {
    request_subgroup_feature(this,SubgroupID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupID",&local_2ee);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee);
  }
  else if (builtin == BuiltInSubgroupLocalInvocationId) {
    request_subgroup_feature(this,SubgroupInvocationID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_SubgroupInvocationID",&local_2f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0);
  }
  else if (builtin == BuiltInVertexIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexID",&local_ac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ac);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexIndex",&local_ab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ab);
    }
  }
  else if (builtin == BuiltInInstanceIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x8c)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d0,"GL_ARB_draw_instanced",&local_d1);
        require_extension_internal(this,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      if (((this->options).vertex.support_nonzero_base_instance & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InstanceID",&local_fb);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fb);
      }
      else {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_f8,"GL_ARB_shader_draw_parameters",&local_f9);
          require_extension_internal(this,&local_f8);
          ::std::__cxx11::string::~string((string *)&local_f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"(gl_InstanceID + SPIRV_Cross_BaseInstance)",
                   &local_fa);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fa);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_InstanceIndex",&local_ad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ad);
    }
  }
  else if (builtin == BuiltInSubgroupEqMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupEqMask",&local_2f1);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  else if (builtin == BuiltInSubgroupGeMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupGeMask",&local_2f2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2);
  }
  else if (builtin == BuiltInSubgroupGtMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupGtMask",&local_2f3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3);
  }
  else if (builtin == BuiltInSubgroupLeMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupLeMask",&local_2f4);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4);
  }
  else if (builtin == BuiltInSubgroupLtMask) {
    request_subgroup_feature(this,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_SubgroupLtMask",&local_2f5);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5);
  }
  else if (builtin == BuiltInBaseVertex) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"BaseVertex not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_158,"GL_ARB_shader_draw_parameters",&local_159);
      require_extension_internal(this,&local_158);
      ::std::__cxx11::string::~string((string *)&local_158);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"SPIRV_Cross_BaseVertex",&local_15a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_15a);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_130,"GL_ARB_shader_draw_parameters",&local_131);
      require_extension_internal(this,&local_130);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseVertexARB",&local_132)
      ;
      ::std::allocator<char>::~allocator((allocator<char> *)&local_132);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseVertex",&local_133);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_133);
    }
  }
  else if (builtin == BuiltInBaseInstance) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"BaseInstance not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1a8,"GL_ARB_shader_draw_parameters",&local_1a9);
      require_extension_internal(this,&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"SPIRV_Cross_BaseInstance",&local_1aa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_180,"GL_ARB_shader_draw_parameters",&local_181);
      require_extension_internal(this,&local_180);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaseInstanceARB",&local_182);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_182);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaseInstance",&local_183);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_183);
    }
  }
  else if (builtin == BuiltInDrawIndex) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"DrawIndex not supported in ES profile.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1f8,"GL_ARB_shader_draw_parameters",&local_1f9);
      require_extension_internal(this,&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawIDARB",&local_1fa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1fa);
    }
    else if ((this->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1d0,"GL_ARB_shader_draw_parameters",&local_1d1);
      require_extension_internal(this,&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawIDARB",&local_1d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DrawID",&local_1d3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d3);
    }
  }
  else if (builtin == BuiltInPrimitiveShadingRateKHR) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3f0,"GL_EXT_fragment_shading_rate",&local_3f1);
    require_extension_internal(this,&local_3f0);
    ::std::__cxx11::string::~string((string *)&local_3f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveShadingRateEXT",&local_3f2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f2);
  }
  else if (builtin == BuiltInDeviceIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Need Vulkan semantics for device group support.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_440,"GL_EXT_device_group",&local_441);
    require_extension_internal(this,&local_440);
    ::std::__cxx11::string::~string((string *)&local_440);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_441);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_DeviceIndex",&local_442);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_442);
  }
  else if (builtin == BuiltInViewIndex) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewID_OVR",&local_2ec);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ViewIndex",&local_2eb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eb);
    }
  }
  else if (builtin == BuiltInShadingRateKHR) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Can only use ShadingRateKHR in Vulkan GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_418,"GL_EXT_fragment_shading_rate",&local_419);
    require_extension_internal(this,&local_418);
    ::std::__cxx11::string::~string((string *)&local_418);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_ShadingRateEXT",&local_41a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41a);
  }
  else if (builtin == BuiltInFragStencilRefEXT) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Stencil export not supported in GLES.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3c8,"GL_ARB_shader_stencil_export",&local_3c9);
    require_extension_internal(this,&local_3c8);
    ::std::__cxx11::string::~string((string *)&local_3c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_FragStencilRefARB",&local_3ca);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3ca);
  }
  else if (builtin == BuiltInFullyCoveredEXT) {
    if (((this->options).es & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Need desktop GL to use GL_NV_conservative_raster_underestimation.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_468,"GL_NV_conservative_raster_underestimation",&local_469);
    require_extension_internal(this,&local_468);
    ::std::__cxx11::string::~string((string *)&local_468);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_469);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_FragFullyCoveredNV",&local_46a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46a);
  }
  else if (builtin == BuiltInBaryCoordKHR) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordEXT requires ESSL 320.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordEXT requires GLSL 450.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_350,"GL_EXT_fragment_shader_barycentric",&local_351);
      require_extension_internal(this,&local_350);
      ::std::__cxx11::string::~string((string *)&local_350);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaryCoordEXT",&local_352);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_352);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_328,"GL_NV_fragment_shader_barycentric",&local_329);
      require_extension_internal(this,&local_328);
      ::std::__cxx11::string::~string((string *)&local_328);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_BaryCoordNV",&local_32a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_32a);
    }
  }
  else if (builtin == BuiltInBaryCoordNoPerspKHR) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordNoPerspEXT requires ESSL 320.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"gl_BaryCoordNoPerspEXT requires GLSL 450.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_3a0,"GL_EXT_fragment_shader_barycentric",&local_3a1);
      require_extension_internal(this,&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaryCoordNoPerspEXT",&local_3a2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_378,"GL_NV_fragment_shader_barycentric",&local_379);
      require_extension_internal(this,&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"gl_BaryCoordNoPerspNV",&local_37a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_37a);
    }
  }
  else if (builtin == BuiltInPrimitivePointIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitivePointIndicesEXT",&local_46d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46d);
  }
  else if (builtin == BuiltInPrimitiveLineIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveLineIndicesEXT",&local_46c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46c);
  }
  else if (builtin == BuiltInPrimitiveTriangleIndicesEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_PrimitiveTriangleIndicesEXT",&local_46b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46b);
  }
  else if (builtin == BuiltInCullPrimitiveEXT) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_CullPrimitiveEXT",&local_46e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46e);
  }
  else if (builtin == BuiltInLaunchIdKHR) {
    pcVar3 = "gl_LaunchIDNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchIDEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2f6);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6);
  }
  else if (builtin == BuiltInLaunchSizeKHR) {
    pcVar3 = "gl_LaunchSizeNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_LaunchSizeEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2f7);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7);
  }
  else if (builtin == BuiltInWorldRayOriginKHR) {
    pcVar3 = "gl_WorldRayOriginNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8);
  }
  else if (builtin == BuiltInWorldRayDirectionKHR) {
    pcVar3 = "gl_WorldRayDirectionNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2f9);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  }
  else if (builtin == BuiltInObjectRayOriginKHR) {
    pcVar3 = "gl_ObjectRayOriginNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayOriginEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2fa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa);
  }
  else if (builtin == BuiltInObjectRayDirectionKHR) {
    pcVar3 = "gl_ObjectRayDirectionNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectRayDirectionEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2fb);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb);
  }
  else if (builtin == BuiltInRayTminKHR) {
    pcVar3 = "gl_RayTminNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTminEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2fc);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc);
  }
  else if (builtin == BuiltInRayTmaxKHR) {
    pcVar3 = "gl_RayTmaxNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_RayTmaxEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2fd);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd);
  }
  else if (builtin == BuiltInInstanceCustomIndexKHR) {
    pcVar3 = "gl_InstanceCustomIndexNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_InstanceCustomIndexEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2fe);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe);
  }
  else if (builtin == BuiltInObjectToWorldKHR) {
    pcVar3 = "gl_ObjectToWorldNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_ObjectToWorldEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_2ff);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff);
  }
  else if (builtin == BuiltInWorldToObjectKHR) {
    pcVar3 = "gl_WorldToObjectNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_WorldToObjectEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_300);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_300);
  }
  else if (builtin == BuiltInHitTNV) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_HitTNV",&local_301);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
  }
  else if (builtin == BuiltInHitKindKHR) {
    pcVar3 = "gl_HitKindNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_HitKindEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_302);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_302);
  }
  else if (builtin == BuiltInIncomingRayFlagsKHR) {
    pcVar3 = "gl_IncomingRayFlagsNV";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      pcVar3 = "gl_IncomingRayFlagsEXT";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_303);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_303);
  }
  else {
    convert_to_string<spv::BuiltIn,_0>(&local_490,&local_1c);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_490,ts_1);
    ::std::__cxx11::string::~string((string *)&local_490);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_ClipDistance";
	}
	case BuiltInCullDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_CullDistance";
	}
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInPatchVertices:
		return "gl_PatchVerticesIn";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}